

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

_Bool bson_iter_init(bson_iter_t *iter,bson_t *bson)

{
  uint uVar1;
  uint8_t *puVar2;
  char *pcVar3;
  undefined8 uStack_20;
  
  if (iter == (bson_iter_t *)0x0) {
    pcVar3 = "iter";
    uStack_20 = 0x2e;
  }
  else {
    if (bson != (bson_t *)0x0) {
      uVar1 = bson->len;
      if (uVar1 < 5) {
        (iter->value).value.v_regex.options = (char *)0x0;
        *(undefined8 *)((long)&(iter->value).value + 0x10) = 0;
        (iter->value).value_type = BSON_TYPE_EOD;
        (iter->value).padding = 0;
        (iter->value).value.v_int64 = 0;
        iter->d3 = 0;
        iter->d4 = 0;
        iter->next_off = 0;
        iter->err_off = 0;
        iter->type = 0;
        iter->key = 0;
        iter->d1 = 0;
        iter->d2 = 0;
        iter->raw = (uint8_t *)0x0;
        iter->len = 0;
        iter->off = 0;
      }
      else {
        puVar2 = bson_get_data(bson);
        iter->raw = puVar2;
        iter->len = bson->len;
        iter->d1 = 0;
        iter->d2 = 0;
        iter->d3 = 0;
        iter->d4 = 0;
        iter->off = 0;
        iter->type = 0;
        iter->key = 0;
        iter->d1 = 0;
        iter->next_off = 4;
        iter->err_off = 0;
      }
      return 4 < uVar1;
    }
    pcVar3 = "bson";
    uStack_20 = 0x2f;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,uStack_20,"bson_iter_init",pcVar3);
  abort();
}

Assistant:

bool
bson_iter_init (bson_iter_t *iter,  /* OUT */
                const bson_t *bson) /* IN */
{
   BSON_ASSERT (iter);
   BSON_ASSERT (bson);

   if (BSON_UNLIKELY (bson->len < 5)) {
      memset (iter, 0, sizeof *iter);
      return false;
   }

   iter->raw = bson_get_data (bson);
   iter->len = bson->len;
   iter->off = 0;
   iter->type = 0;
   iter->key = 0;
   iter->d1 = 0;
   iter->d2 = 0;
   iter->d3 = 0;
   iter->d4 = 0;
   iter->next_off = 4;
   iter->err_off = 0;

   return true;
}